

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitBdd.c
# Opt level: O3

int Kit_SopFactorVerify(Vec_Int_t *vCover,Kit_Graph_t *pFForm,int nVars)

{
  int iVar1;
  Vec_Int_t *vMemory;
  int *piVar2;
  DdNode *n;
  DdNode *n_00;
  int iVar3;
  Kit_Sop_t *cSop;
  Kit_Sop_t Sop;
  Kit_Sop_t KStack_38;
  
  if (Kit_SopFactorVerify::dd == (DdManager *)0x0) {
    Kit_SopFactorVerify::dd = Cudd_Init(0x10,0,0x100,0x40000,0);
  }
  iVar1 = vCover->nSize;
  vMemory = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar3 = iVar1;
  }
  vMemory->nSize = 0;
  vMemory->nCap = iVar3;
  if (iVar3 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar3 << 2);
  }
  vMemory->pArray = piVar2;
  Kit_SopCreate(&KStack_38,vCover,nVars,vMemory);
  n = Kit_SopToBdd(Kit_SopFactorVerify::dd,&KStack_38,nVars);
  Cudd_Ref(n);
  n_00 = Kit_GraphToBdd(Kit_SopFactorVerify::dd,pFForm);
  Cudd_Ref(n_00);
  if (n != n_00) {
    Extra_bddPrint(Kit_SopFactorVerify::dd,n);
    putchar(10);
    Extra_bddPrint(Kit_SopFactorVerify::dd,n_00);
    putchar(10);
  }
  Cudd_RecursiveDeref(Kit_SopFactorVerify::dd,n);
  Cudd_RecursiveDeref(Kit_SopFactorVerify::dd,n_00);
  if (vMemory->pArray != (int *)0x0) {
    free(vMemory->pArray);
  }
  free(vMemory);
  return (uint)(n == n_00);
}

Assistant:

int Kit_SopFactorVerify( Vec_Int_t * vCover, Kit_Graph_t * pFForm, int nVars )
{
    static DdManager * dd = NULL;
    Kit_Sop_t Sop, * cSop = &Sop;
    DdNode * bFunc1, * bFunc2;
    Vec_Int_t * vMemory;
    int RetValue;
    // get the manager
    if ( dd == NULL )
        dd = Cudd_Init( 16, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    // derive SOP
    vMemory = Vec_IntAlloc( Vec_IntSize(vCover) );
    Kit_SopCreate( cSop, vCover, nVars, vMemory );
    // get the functions
    bFunc1 = Kit_SopToBdd( dd, cSop, nVars );      Cudd_Ref( bFunc1 );
    bFunc2 = Kit_GraphToBdd( dd, pFForm );         Cudd_Ref( bFunc2 );
//Extra_bddPrint( dd, bFunc1 ); printf("\n");
//Extra_bddPrint( dd, bFunc2 ); printf("\n");
    RetValue = (bFunc1 == bFunc2);
    if ( bFunc1 != bFunc2 )
    {
        int s;
        Extra_bddPrint( dd, bFunc1 ); printf("\n");
        Extra_bddPrint( dd, bFunc2 ); printf("\n");
        s  = 0;
    }
    Cudd_RecursiveDeref( dd, bFunc1 );
    Cudd_RecursiveDeref( dd, bFunc2 );
    Vec_IntFree( vMemory );
    return RetValue;
}